

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_util.c
# Opt level: O2

attr_list CMint_add_ref_attr_list(CManager cm,attr_list l,char *file,int line)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  __pid_t _Var3;
  pthread_t pVar4;
  attr_list p_Var5;
  timespec ts;
  
  if (l == (attr_list)0x0) {
    return (attr_list)0x0;
  }
  iVar1 = attr_list_ref_count(l);
  iVar2 = CMtrace_val[8];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(cm,CMAttrVerbose);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      __stream = (FILE *)cm->CMTrace_file;
      _Var3 = getpid();
      pVar4 = pthread_self();
      fprintf(__stream,"P%lxT%lx - ",(long)_Var3,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"Adding ref attr list %p at %s:%d, ref count now %d\n",l,file,
            (ulong)(uint)line,(ulong)(iVar1 + 1));
  }
  fflush((FILE *)cm->CMTrace_file);
  p_Var5 = (attr_list)add_ref_attr_list(l);
  return p_Var5;
}

Assistant:

extern attr_list 
CMint_add_ref_attr_list(CManager cm, attr_list l, char *file, int line)
{
    int count;
    (void)cm;
    if (l == NULL) return NULL;
    count = attr_list_ref_count(l);
    CMtrace_out(cm, CMAttrVerbose, "Adding ref attr list %p at %s:%d, ref count now %d\n", 
		l, file, line, count+1);
    return add_ref_attr_list(l);
}